

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_inverse(matd_t *x)

{
  matd_t mVar1;
  int iVar2;
  matd_plu_t *mlu;
  matd_t *b;
  double dVar3;
  matd_t *ident;
  matd_t *inv;
  matd_plu_t *plu;
  double invdet_1;
  double det_1;
  double invdet;
  double det;
  matd_t *m;
  matd_t *x_local;
  
  if (x == (matd_t *)0x0) {
    __assert_fail("x != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1e4,"matd_t *matd_inverse(const matd_t *)");
  }
  if (x->nrows == x->ncols) {
    iVar2 = matd_is_scalar(x);
    if (iVar2 == 0) {
      if (x->nrows == 1) {
        mVar1 = x[1];
        if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
          x_local = matd_create(x->nrows,x->nrows);
          x_local[1] = (matd_t)((1.0 / (double)mVar1) * 1.0);
        }
        else {
          x_local = (matd_t *)0x0;
        }
      }
      else if (x->nrows == 2) {
        dVar3 = (double)x[1] * (double)x[4] + -((double)x[2] * (double)x[3]);
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          dVar3 = 1.0 / dVar3;
          x_local = matd_create(x->nrows,x->nrows);
          x_local[1] = (matd_t)((double)x[(ulong)(x->ncols + 1) + 1] * dVar3);
          x_local[2] = (matd_t)(-(double)x[2] * dVar3);
          x_local[(ulong)x_local->ncols + 1] = (matd_t)(-(double)x[(ulong)x->ncols + 1] * dVar3);
          x_local[(ulong)(x_local->ncols + 1) + 1] = (matd_t)((double)x[1] * dVar3);
        }
        else {
          x_local = (matd_t *)0x0;
        }
      }
      else {
        mlu = matd_plu(x);
        ident = (matd_t *)0x0;
        if (mlu->singular == 0) {
          b = matd_identity(x->nrows);
          ident = matd_plu_solve(mlu,b);
          matd_destroy(b);
        }
        matd_plu_destroy(mlu);
        x_local = ident;
      }
    }
    else if (((double)x[1] != 0.0) || (NAN((double)x[1]))) {
      x_local = matd_create_scalar(1.0 / (double)x[1]);
    }
    else {
      x_local = (matd_t *)0x0;
    }
    return x_local;
  }
  __assert_fail("x->nrows == x->ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x1e5,"matd_t *matd_inverse(const matd_t *)");
}

Assistant:

matd_t *matd_inverse(const matd_t *x)
{
    matd_t *m = NULL;

    assert(x != NULL);
    assert(x->nrows == x->ncols);

    if (matd_is_scalar(x)) {
        if (x->data[0] == 0)
            return NULL;

        return matd_create_scalar(1.0 / x->data[0]);
    }

    switch(x->nrows) {
        case 1: {
            double det = x->data[0];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = 1.0 * invdet;
            return m;
        }

        case 2: {
            double det = x->data[0] * x->data[3] - x->data[1] * x->data[2];
            if (det == 0)
                return NULL;

            double invdet = 1.0 / det;

            m = matd_create(x->nrows, x->nrows);
            MATD_EL(m, 0, 0) = MATD_EL(x, 1, 1) * invdet;
            MATD_EL(m, 0, 1) = - MATD_EL(x, 0, 1) * invdet;
            MATD_EL(m, 1, 0) = - MATD_EL(x, 1, 0) * invdet;
            MATD_EL(m, 1, 1) = MATD_EL(x, 0, 0) * invdet;
            return m;
        }

        default: {
            matd_plu_t *plu = matd_plu(x);

            matd_t *inv = NULL;
            if (!plu->singular) {
                matd_t *ident = matd_identity(x->nrows);
                inv = matd_plu_solve(plu, ident);
                matd_destroy(ident);
            }

            matd_plu_destroy(plu);

            return inv;
        }
    }

    return NULL; // unreachable
}